

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP3Writer::~BP3Writer(BP3Writer *this)

{
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__BP3Writer_0081be60;
  (this->super_Engine).m_IsOpen = false;
  transportman::TransportMan::~TransportMan(&this->m_FileMetadataManager);
  transportman::TransportMan::~TransportMan(&this->m_FileDataManager);
  adios2::format::BP3Serializer::~BP3Serializer(&this->m_BP3Serializer);
  Engine::~Engine(&this->super_Engine);
  return;
}

Assistant:

BP3Writer::~BP3Writer()
{
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}